

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTracerThread.cpp
# Opt level: O0

void __thiscall PathTracerThread::path_tracer_thread_func(PathTracerThread *this)

{
  uint uVar1;
  bool bVar2;
  element_type *peVar3;
  element_type *this_00;
  void *__stat_loc;
  atomic<bool> *in_RDI;
  PathTracerThread *this_01;
  VkFenceCreateFlags unaff_retaddr;
  Ptr<Device> *in_stack_00000008;
  VkCommandBufferLevel in_stack_00000014;
  Ptr<CommandPool> *in_stack_00000018;
  shared_ptr<myvk::CommandBuffer> pt_command_buffer;
  shared_ptr<myvk::Fence> fence;
  shared_ptr<myvk::CommandPool> pt_command_pool;
  shared_ptr<PathTracer> *path_tracer;
  shared_ptr<myvk::Device> *device;
  shared_ptr<myvk::CommandBuffer> *in_stack_000001f8;
  PathTracer *in_stack_00000200;
  PathTracerThread *in_stack_00000250;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 uVar4;
  VkCommandBufferUsageFlags in_stack_ffffffffffffffac;
  CommandBuffer *in_stack_ffffffffffffffb0;
  
  spdlog::info<char[25]>((char (*) [25])0x18036f);
  this_01 = (PathTracerThread *)(in_RDI + 0x20);
  std::__shared_ptr_access<myvk::Queue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<myvk::Queue,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x180382)
  ;
  myvk::Queue::WaitIdle((Queue *)in_stack_ffffffffffffffb0);
  peVar3 = std::__shared_ptr_access<myvk::Queue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::Queue,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x180394);
  (*(peVar3->super_DeviceObjectBase).super_Base._vptr_Base[2])();
  this_00 = std::__shared_ptr_access<PathTracerViewer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<PathTracerViewer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1803af);
  PathTracerViewer::GetPathTracerPtr(this_00);
  uVar4 = 0;
  myvk::CommandPool::Create((Ptr<Queue> *)in_stack_00000018,in_stack_00000014);
  myvk::Fence::Create(in_stack_00000008,unaff_retaddr);
  myvk::CommandBuffer::Create(in_stack_00000018,in_stack_00000014);
  std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x180407);
  myvk::CommandBuffer::Begin(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  std::__shared_ptr_access<PathTracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<PathTracer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x18041d);
  PathTracer::CmdRender(in_stack_00000200,in_stack_000001f8);
  std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x180436);
  myvk::CommandBuffer::End((CommandBuffer *)0x18043e);
  acquire_resources(in_stack_00000250);
  while (bVar2 = std::atomic<bool>::load(in_RDI,(memory_order)((ulong)this_01 >> 0x20)), bVar2) {
    std::__shared_ptr_access<myvk::Fence,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<myvk::Fence,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x180477);
    myvk::Fence::Reset((Fence *)this_01);
    std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x18048b);
    myvk::CommandBuffer::Submit
              (pt_command_buffer.super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr,(Ptr<Fence> *)in_stack_00000018);
    std::__shared_ptr_access<myvk::Fence,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<myvk::Fence,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1804a4);
    myvk::Fence::Wait((Fence *)CONCAT44(uVar4,in_stack_ffffffffffffffa0),(uint64_t)in_RDI);
    uVar1 = *(uint *)(in_RDI + 0x104);
    *(uint *)(in_RDI + 0x104) = uVar1 + 1;
    if (uVar1 % 10 == 0) {
      UpdateViewer(this_01);
    }
    while( true ) {
      __stat_loc = (void *)0x2;
      bVar2 = std::atomic<bool>::load(in_RDI,(memory_order)((ulong)this_01 >> 0x20));
      if (!bVar2) break;
      spdlog::debug<char[23]>((char (*) [23])0x180554);
      binary_semaphore::wait((binary_semaphore *)(in_RDI + 0x40),__stat_loc);
    }
  }
  release_resources(in_stack_00000250);
  spdlog::info<char[24]>((char (*) [24])0x180585);
  std::shared_ptr<myvk::CommandBuffer>::~shared_ptr((shared_ptr<myvk::CommandBuffer> *)0x180591);
  std::shared_ptr<myvk::Fence>::~shared_ptr((shared_ptr<myvk::Fence> *)0x18059b);
  std::shared_ptr<myvk::CommandPool>::~shared_ptr((shared_ptr<myvk::CommandPool> *)0x1805a5);
  return;
}

Assistant:

void PathTracerThread::path_tracer_thread_func() {
	spdlog::info("Enter path tracer thread");

	m_main_queue->WaitIdle();

	const std::shared_ptr<myvk::Device> &device = m_main_queue->GetDevicePtr();
	const std::shared_ptr<PathTracer> &path_tracer = m_path_tracer_viewer_ptr->GetPathTracerPtr();

	std::shared_ptr<myvk::CommandPool> pt_command_pool = myvk::CommandPool::Create(m_path_tracer_queue);

	std::shared_ptr<myvk::Fence> fence = myvk::Fence::Create(device);

	std::shared_ptr<myvk::CommandBuffer> pt_command_buffer = myvk::CommandBuffer::Create(pt_command_pool);
	pt_command_buffer->Begin();
	path_tracer->CmdRender(pt_command_buffer);
	pt_command_buffer->End();

	acquire_resources();

	while (m_run.load(std::memory_order_acquire)) {
		fence->Reset();
		pt_command_buffer->Submit(fence);
		fence->Wait();

		if ((m_spp++) % kPTResultUpdateInterval == 0)
			UpdateViewer();

		while (m_pause.load(std::memory_order_acquire)) {
			spdlog::debug("m_pause_semaphore wait");
			m_pause_semaphore.wait();
		}
	}

	release_resources();

	spdlog::info("Quit path tracer thread");
}